

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void __thiscall Config::Load(Config *this)

{
  FILE *__stream;
  FileReadStream inputStream;
  char buffer [65536];
  FileReadStream FStack_10058;
  char acStack_10018 [65536];
  
  __stream = fopen(this->_FilePath,"r");
  if (__stream != (FILE *)0x0) {
    rapidjson::FileReadStream::FileReadStream(&FStack_10058,(FILE *)__stream,acStack_10018,0x10000);
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
    ::ParseStream<0u,rapidjson::UTF8<char>,rapidjson::FileReadStream>
              ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                *)this,&FStack_10058);
    fclose(__stream);
    this->loaded = true;
  }
  return;
}

Assistant:

void Config::Load()
{
    FILE* fp = fopen(_FilePath,"r");
    if (fp == NULL)
        return;
    char buffer[65536];
    rapidjson::FileReadStream inputStream(fp,buffer, sizeof(buffer));
    Settings.ParseStream(inputStream);
    fclose(fp);
    loaded = true;
}